

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O2

void * raviX_realloc(void *p,size_t size)

{
  void *pvVar1;
  
  pvVar1 = realloc(p,size);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  fwrite("out of memory\n",0xe,1,_stderr);
  exit(1);
}

Assistant:

void *raviX_realloc(void *p, size_t size)
{
	void *ptr;
	ptr = realloc(p, size);
        if (!ptr) {
                fprintf(stderr, "out of memory\n");
                exit(1);
        }
	return ptr;
}